

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  bool bVar2;
  float *pfVar3;
  bool bVar4;
  Vector<float,_2> *pVVar5;
  bool bVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float v;
  float fVar10;
  float fVar11;
  float local_3c [5];
  Type in1;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar8 = (evalCtx->coords).m_data[0];
    fVar9 = (evalCtx->coords).m_data[1];
  }
  else {
    fVar8 = 1.2;
    fVar9 = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    in1.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data[0] = (float)uVar1;
    in1.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.8;
    in1.m_data.m_data[0].m_data[1] = 0.5;
    in1.m_data.m_data[1].m_data[0] = 0.1;
    in1.m_data.m_data[1].m_data[1] = -0.9;
  }
  local_3c[1] = 0.0;
  local_3c[0] = 0.0;
  pfVar3 = local_3c + 1;
  pVVar5 = (Vector<float,_2> *)&in1;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    fVar10 = 0.0;
    lVar7 = 0;
    fVar11 = fVar8;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      fVar10 = fVar10 + fVar11 * pVVar5->m_data[lVar7];
      lVar7 = 1;
      fVar11 = fVar9;
      bVar2 = false;
    } while (bVar6);
    *pfVar3 = fVar10;
    pfVar3 = local_3c;
    pVVar5 = in1.m_data.m_data + 1;
    bVar2 = false;
  } while (bVar4);
  local_3c[2] = local_3c[1];
  local_3c[3] = local_3c[0];
  local_3c[4] = local_3c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar7 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar7]] = local_3c[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}